

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O1

void __thiscall
pele::physics::pltfilemanager::PltFileManager::readLevelBoxArray
          (PltFileManager *this,int a_lev,BoxArray *a_grid)

{
  pointer pcVar1;
  uint uVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  pointer *ppcVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __val;
  pointer pcVar10;
  uint __len;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string fileCharPtrString;
  string line;
  string lvlHeader;
  istringstream is;
  Vector<char,_std::allocator<char>_> local_238;
  pointer *local_218;
  long local_210;
  pointer local_208;
  long lStack_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  string local_1d8;
  BoxArray *local_1b8;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  ios_base local_138 [264];
  
  pcVar1 = (this->m_pltFile)._M_dataplus._M_p;
  local_1f8 = &local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar1,pcVar1 + (this->m_pltFile)._M_string_length);
  std::__cxx11::string::append((char *)&local_1f8);
  local_1b8 = a_grid;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1f8,(anonymous_namespace)::level_prefix_abi_cxx11_);
  ppcVar7 = (pointer *)(plVar4 + 2);
  if ((pointer *)*plVar4 == ppcVar7) {
    local_208 = *ppcVar7;
    lStack_200 = plVar4[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *ppcVar7;
    local_218 = (pointer *)*plVar4;
  }
  local_210 = plVar4[1];
  *plVar4 = (long)ppcVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __val = -a_lev;
  if (0 < a_lev) {
    __val = a_lev;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_004c76e8;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_004c76e8;
      }
      if (uVar6 < 10000) goto LAB_004c76e8;
      uVar9 = uVar9 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_004c76e8:
  ppcVar7 = &local_238.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_238.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppcVar7;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)__len - (char)(a_lev >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_238.super_vector<char,_std::allocator<char>_>.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + (ulong)((uint)a_lev >> 0x1f)),__len,
             __val);
  pcVar10 = (pointer)0xf;
  if (local_218 != &local_208) {
    pcVar10 = local_208;
  }
  if (pcVar10 < local_238.super_vector<char,_std::allocator<char>_>.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish + local_210) {
    pcVar10 = (pointer)0xf;
    if ((pointer *)
        local_238.super_vector<char,_std::allocator<char>_>.
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
        ppcVar7) {
      pcVar10 = local_238.super_vector<char,_std::allocator<char>_>.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
    }
    if (local_238.super_vector<char,_std::allocator<char>_>.
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish +
        local_210 <= pcVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_218);
      goto LAB_004c7772;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_218,
                      (ulong)local_238.super_vector<char,_std::allocator<char>_>.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
LAB_004c7772:
  local_1b0 = &local_1a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1a0 = *plVar4;
    uStack_198 = puVar5[3];
  }
  else {
    local_1a0 = *plVar4;
    local_1b0 = (long *)*puVar5;
  }
  local_1a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1d8.field_2._M_allocated_capacity = *psVar8;
    local_1d8.field_2._8_8_ = plVar4[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar8;
    local_1d8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1d8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((pointer *)
      local_238.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      ppcVar7) {
    operator_delete(local_238.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(ulong)(local_238.super_vector<char,_std::allocator<char>_>.
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,(ulong)(local_208 + 1));
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  local_238.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (char *)0x0;
  local_238.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_238.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_1b0 = (long *)CONCAT44(local_1b0._4_4_,amrex::ParallelDescriptor::m_comm);
  amrex::ParallelDescriptor::ReadAndBcastFile(&local_1d8,&local_238,true,(MPI_Comm *)&local_1b0);
  std::__cxx11::string::string
            ((string *)&local_218,
             local_238.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)&local_1b0);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1b0,(string *)&local_218,_S_in)
  ;
  local_1f0 = 0;
  local_1e8 = 0;
  local_1f8 = &local_1e8;
  cVar3 = std::ios::widen((char)(istringstream *)&local_1b0 + (char)local_1b0[-3]);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_1b0,(string *)&local_1f8,cVar3);
  std::istream::ignore((long)&local_1b0,100000);
  std::istream::ignore((long)&local_1b0,100000);
  std::istream::ignore((long)&local_1b0,100000);
  amrex::BoxArray::readFrom(local_1b8,(istream *)&local_1b0);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_218 != &local_208) {
    operator_delete(local_218,(ulong)(local_208 + 1));
  }
  if (local_238.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (char *)0x0) {
    operator_delete(local_238.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_238.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_238.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
PltFileManager::readLevelBoxArray(int a_lev, BoxArray& a_grid)
{
  const std::string lvlHeader(
    m_pltFile + "/" + level_prefix + std::to_string(a_lev) + "/Cell_H");

  Vector<char> fileCharPtr;
  ParallelDescriptor::ReadAndBcastFile(lvlHeader, fileCharPtr);
  std::string fileCharPtrString(fileCharPtr.dataPtr());
  std::istringstream is(fileCharPtrString, std::istringstream::in);

  std::string line;

  std::getline(is, line); // Skip
  GotoNextLine(is);       // Skip
  GotoNextLine(is);       // Skip
  GotoNextLine(is);       // Skip
  a_grid.readFrom(is);
}